

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int *aRegIdx,int iDataCur,int iIdxCur,int regNewData,
               int regOldData,u8 pkChng,u8 overrideError,int ignoreDest,int *pbMayReplace)

{
  short sVar1;
  ushort uVar2;
  sqlite3 *db;
  Column *pCVar3;
  ExprList *pEVar4;
  int *piVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int addr;
  Vdbe *p;
  char *pcVar13;
  Index *pIVar14;
  CollSeq *zP4;
  Parse *pPVar15;
  Trigger *pTVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  short *psVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ExprList *pCheck;
  int local_ec;
  Index *local_c8;
  uint local_78;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  sVar1 = pTab->nCol;
  if ((pTab->tabFlags & 0x20) == 0) {
    local_78 = 1;
    local_c8 = (Index *)0x0;
  }
  else {
    for (local_c8 = pTab->pIndex; (local_c8 != (Index *)0x0 && ((local_c8->field_0x5b & 3) != 2));
        local_c8 = local_c8->pNext) {
    }
    local_78 = (uint)local_c8->nKeyCol;
  }
  if (0 < sVar1) {
    iVar8 = regNewData + 1;
    lVar24 = 0;
    uVar19 = 0;
    do {
      if (uVar19 != (uint)(int)pTab->iPKey) {
        pCVar3 = pTab->aCol;
        bVar7 = (&pCVar3->notNull)[lVar24];
        if (bVar7 != 0) {
          if (bVar7 == 10) {
            bVar7 = 2;
          }
          if (overrideError != '\n') {
            bVar7 = overrideError;
          }
          if (bVar7 == 5) {
            uVar25 = (uint)(*(long *)((long)&pCVar3->pDflt + lVar24) != 0) * 3 + 2;
          }
          else {
            uVar25 = (uint)bVar7;
          }
          iVar10 = (int)uVar19;
          switch(uVar25) {
          case 2:
            pPVar15 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar15 = pParse;
            }
            pPVar15->mayAbort = '\x01';
          case 1:
          case 3:
            pcVar13 = sqlite3MPrintf(db,"%s.%s",pTab->zName,
                                     *(undefined8 *)((long)&pCVar3->zName + lVar24));
            iVar10 = sqlite3VdbeAddOp3(p,0x17,0x513,uVar25,iVar8 + iVar10);
            sqlite3VdbeChangeP4(p,iVar10,pcVar13,-1);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x01';
            }
            break;
          case 4:
            sqlite3VdbeAddOp3(p,0x4c,iVar8 + iVar10,ignoreDest,0);
            break;
          default:
            uVar9 = sqlite3VdbeAddOp3(p,0x4d,iVar8 + iVar10,0,0);
            sqlite3ExprCode(pParse,*(Expr **)((long)&pTab->aCol->pDflt + lVar24),iVar8 + iVar10);
            uVar25 = p->nOp;
            if (uVar9 < uVar25) {
              p->aOp[uVar9].p2 = uVar25;
            }
            p->pParse->iFixedOp = uVar25 - 1;
          }
        }
      }
      uVar19 = uVar19 + 1;
      lVar24 = lVar24 + 0x30;
    } while ((long)sVar1 != uVar19);
  }
  pEVar4 = pTab->pCheck;
  if (((pEVar4 != (ExprList *)0x0) && ((db->flags & 0x2000) == 0)) &&
     (pParse->ckBase = regNewData + 1, 0 < pEVar4->nExpr)) {
    bVar7 = overrideError;
    if (overrideError == '\n') {
      bVar7 = 2;
    }
    uVar25 = (uint)bVar7;
    lVar23 = 0;
    lVar24 = 0;
    do {
      uVar9 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfTrue(pParse,*(Expr **)((long)&pEVar4->a->pExpr + lVar23),uVar9,0x10);
      if (uVar25 == 4) {
        sqlite3VdbeAddOp3(p,0x10,0,ignoreDest,0);
        uVar25 = 4;
      }
      else {
        pcVar13 = *(char **)((long)&pEVar4->a->zName + lVar23);
        if (pcVar13 == (char *)0x0) {
          pcVar13 = pTab->zName;
        }
        if (uVar25 == 5) {
          uVar25 = 2;
        }
        sqlite3HaltConstraint(pParse,0x113,uVar25,pcVar13,'\0','\x03');
      }
      pPVar15 = p->pParse;
      if (((int)uVar9 < 0) && (piVar5 = pPVar15->aLabel, piVar5 != (int *)0x0)) {
        piVar5[~uVar9] = p->nOp;
      }
      pPVar15->iFixedOp = p->nOp + -1;
      lVar24 = lVar24 + 1;
      lVar23 = lVar23 + 0x20;
    } while (lVar24 < pEVar4->nExpr);
  }
  uVar25 = 0;
  if (pkChng == '\0') {
    uVar9 = 0;
    iVar8 = 0;
    goto LAB_0016cc18;
  }
  uVar9 = 0;
  iVar8 = 0;
  uVar25 = 0;
  if (local_c8 != (Index *)0x0) goto LAB_0016cc18;
  uVar25 = sqlite3VdbeMakeLabel(p);
  bVar7 = overrideError;
  if (overrideError == '\n') {
    bVar7 = 2;
    if (pTab->keyConf != 10) {
      bVar7 = pTab->keyConf;
    }
  }
  if (regOldData != 0) {
    sqlite3VdbeAddOp3(p,0x4f,regNewData,uVar25,regOldData);
    if (p->aOp != (Op *)0x0) {
      p->aOp[(long)p->nOp + -1].p5 = 0x90;
    }
  }
  uVar9 = 0;
  if ((overrideError != '\x05') && (bVar7 == 5)) {
    for (pIVar14 = pTab->pIndex; pIVar14 != (Index *)0x0; pIVar14 = pIVar14->pNext) {
      if ((byte)(pIVar14->onError - 3) < 2) {
        uVar9 = sqlite3VdbeAddOp3(p,0x10,0,0,0);
        break;
      }
    }
  }
  sqlite3VdbeAddOp3(p,0x46,iDataCur,uVar25,regNewData);
  uVar22 = (uint)bVar7;
  if (uVar22 - 1 < 3) {
LAB_0016cb99:
    sqlite3RowidConstraint(pParse,(uint)bVar7,pTab);
    iVar8 = 0;
  }
  else if (uVar22 == 4) {
    iVar8 = 0;
    sqlite3VdbeAddOp3(p,0x10,0,ignoreDest,0);
  }
  else {
    if (uVar22 != 5) {
      bVar7 = 2;
      goto LAB_0016cb99;
    }
    if ((db->flags & 0x40000) == 0) {
      pTVar16 = (Trigger *)0x0;
    }
    else {
      pTVar16 = sqlite3TriggersExist(pParse,pTab,0x6d,(ExprList *)0x0,(int *)0x0);
    }
    if ((pTVar16 == (Trigger *)0x0) &&
       (iVar8 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar8 == 0)) {
      iVar8 = 1;
      if (pTab->pIndex != (Index *)0x0) {
        pPVar15 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar15 = pParse;
        }
        pPVar15->isMultiWrite = '\x01';
        sqlite3GenerateRowIndexDelete(pParse,pTab,iDataCur,iIdxCur,(int *)0x0);
      }
    }
    else {
      pPVar15 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar15 = pParse;
      }
      pPVar15->isMultiWrite = '\x01';
      iVar8 = 1;
      sqlite3GenerateRowDelete(pParse,pTab,pTVar16,iDataCur,iIdxCur,regNewData,1,'\0','\x05','\x01')
      ;
    }
  }
  pPVar15 = p->pParse;
  if (((int)uVar25 < 0) && (piVar5 = pPVar15->aLabel, piVar5 != (int *)0x0)) {
    piVar5[~uVar25] = p->nOp;
  }
  pPVar15->iFixedOp = p->nOp + -1;
  if (uVar9 == 0) {
    uVar25 = 0;
  }
  else {
    uVar25 = sqlite3VdbeAddOp3(p,0x10,0,0,0);
    uVar22 = p->nOp;
    if (uVar9 < uVar22) {
      p->aOp[uVar9].p2 = uVar22;
    }
    p->pParse->iFixedOp = uVar22 - 1;
  }
LAB_0016cc18:
  pIVar14 = pTab->pIndex;
  if (pIVar14 != (Index *)0x0) {
    iVar10 = regNewData + 1;
    uVar22 = 0xffffffff;
    lVar24 = 0;
    bVar6 = false;
    do {
      if (aRegIdx[lVar24] != 0) {
        if (!bVar6) {
          sqlite3TableAffinity(p,pTab,iVar10);
          bVar6 = true;
        }
        uVar11 = sqlite3VdbeMakeLabel(p);
        if (pIVar14->pPartIdxWhere != (Expr *)0x0) {
          sqlite3VdbeAddOp3(p,0x1c,0,aRegIdx[lVar24],0);
          pParse->ckBase = iVar10;
          sqlite3ExprIfFalse(pParse,pIVar14->pPartIdxWhere,uVar11,0x10);
          pParse->ckBase = 0;
        }
        uVar2 = pIVar14->nColumn;
        if (pParse->nRangeReg < (int)(uint)uVar2) {
          local_ec = pParse->nMem + 1;
          pParse->nMem = (uint)uVar2 + pParse->nMem;
        }
        else {
          local_ec = pParse->iRangeReg;
          pParse->iRangeReg = (uint)uVar2 + local_ec;
          pParse->nRangeReg = pParse->nRangeReg - (uint)uVar2;
        }
        uVar2 = pIVar14->nColumn;
        if (uVar2 != 0) {
          uVar19 = 0;
          do {
            sVar1 = pIVar14->aiColumn[uVar19];
            iVar12 = (int)uVar19;
            if ((sVar1 < 0) || (sVar1 == pTab->iPKey)) {
              if (local_ec + iVar12 != uVar22) {
                uVar22 = -(uint)(pIVar14->pPartIdxWhere != (Expr *)0x0) | local_ec + iVar12;
                iVar18 = regNewData;
                goto LAB_0016cdb1;
              }
            }
            else {
              iVar18 = sVar1 + iVar10;
LAB_0016cdb1:
              sqlite3VdbeAddOp3(p,0x22,iVar18,local_ec + iVar12,0);
            }
            uVar19 = uVar19 + 1;
            uVar2 = pIVar14->nColumn;
          } while (uVar19 < uVar2);
        }
        sqlite3VdbeAddOp3(p,0x31,local_ec,(uint)uVar2,aRegIdx[lVar24]);
        sqlite3ExprCacheRemove(pParse,local_ec,(uint)pIVar14->nColumn);
        if (((regOldData == 0) || (pkChng != '\0')) || (local_c8 != pIVar14)) {
          bVar7 = pIVar14->onError;
          if (bVar7 == 0) {
            uVar17 = (uint)pIVar14->nColumn;
            sqlite3ExprCacheRemove(pParse,local_ec,uVar17);
            if (pParse->nRangeReg < (int)uVar17) {
              pParse->nRangeReg = uVar17;
              pParse->iRangeReg = local_ec;
            }
            pPVar15 = p->pParse;
            if (((int)uVar11 < 0) && (piVar5 = pPVar15->aLabel, piVar5 != (int *)0x0)) {
              piVar5[~uVar11] = p->nOp;
            }
            pPVar15->iFixedOp = p->nOp + -1;
          }
          else {
            if (bVar7 == 10) {
              bVar7 = 2;
            }
            if (overrideError != '\n') {
              bVar7 = overrideError;
            }
            uVar2 = pIVar14->nKeyCol;
            iVar18 = (int)(lVar24 + (ulong)(uint)iIdxCur);
            iVar12 = sqlite3VdbeAddOp3(p,0x43,iVar18,uVar11,local_ec);
            sqlite3VdbeChangeP4(p,iVar12,(char *)(ulong)uVar2,-0xe);
            iVar12 = local_ec;
            if (pIVar14 != local_c8) {
              if (pParse->nRangeReg < (int)local_78) {
                iVar12 = pParse->nMem + 1;
                pParse->nMem = pParse->nMem + local_78;
              }
              else {
                iVar12 = pParse->iRangeReg;
                pParse->iRangeReg = local_78 + iVar12;
                pParse->nRangeReg = pParse->nRangeReg - local_78;
              }
            }
            if ((regOldData != 0) || (bVar7 == 5)) {
              if ((pTab->tabFlags & 0x20) == 0) {
                sqlite3VdbeAddOp3(p,0x70,iVar18,iVar12,0);
                if (regOldData != 0) {
                  sqlite3VdbeAddOp3(p,0x4f,iVar12,uVar11,regOldData);
                  if (p->aOp != (Op *)0x0) {
                    p->aOp[(long)p->nOp + -1].p5 = 0x90;
                  }
                }
              }
              else {
                if ((pIVar14 != local_c8) && (local_c8->nKeyCol != 0)) {
                  uVar19 = 0;
                  do {
                    iVar21 = -1;
                    if (pIVar14->nColumn != 0) {
                      psVar20 = pIVar14->aiColumn;
                      lVar23 = 0;
                      do {
                        if (*psVar20 == local_c8->aiColumn[uVar19]) {
                          iVar21 = (int)lVar23 >> 0x10;
                          break;
                        }
                        lVar23 = lVar23 + 0x10000;
                        psVar20 = psVar20 + 1;
                      } while ((ulong)pIVar14->nColumn * 0x10000 != lVar23);
                    }
                    sqlite3VdbeAddOp3(p,0x2f,iVar18,iVar21,iVar12 + (int)uVar19);
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < local_c8->nKeyCol);
                }
                if ((regOldData != 0) && (local_c8->nKeyCol != 0)) {
                  iVar18 = iVar12;
                  if ((pIVar14->field_0x5b & 3) == 2) {
                    iVar18 = local_ec;
                  }
                  uVar17 = (uint)local_c8->nKeyCol + p->nOp;
                  iVar21 = 0x4e;
                  uVar19 = 0;
                  do {
                    zP4 = sqlite3LocateCollSeq(pParse,local_c8->azColl[uVar19]);
                    if (uVar19 == local_c8->nKeyCol - 1) {
                      iVar21 = 0x4f;
                      uVar17 = uVar11;
                    }
                    addr = sqlite3VdbeAddOp3(p,iVar21,(int)local_c8->aiColumn[uVar19] +
                                                      regOldData + 1,uVar17,iVar18 + (int)uVar19);
                    sqlite3VdbeChangeP4(p,addr,(char *)zP4,-4);
                    if (p->aOp != (Op *)0x0) {
                      p->aOp[(long)p->nOp + -1].p5 = 0x90;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < local_c8->nKeyCol);
                }
              }
            }
            if (bVar7 - 1 < 3) {
              sqlite3UniqueConstraint(pParse,(uint)bVar7,pIVar14);
            }
            else if (bVar7 == 4) {
              sqlite3VdbeAddOp3(p,0x10,0,ignoreDest,0);
            }
            else {
              pPVar15 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar15 = pParse;
              }
              pPVar15->isMultiWrite = '\x01';
              if ((db->flags & 0x40000) == 0) {
                pTVar16 = (Trigger *)0x0;
              }
              else {
                pTVar16 = sqlite3TriggersExist(pParse,pTab,0x6d,(ExprList *)0x0,(int *)0x0);
              }
              sqlite3GenerateRowDelete
                        (pParse,pTab,pTVar16,iDataCur,iIdxCur,iVar12,(i16)local_78,'\0','\x05',
                         pIVar14 == local_c8);
              iVar8 = 1;
            }
            pPVar15 = p->pParse;
            if (((int)uVar11 < 0) && (piVar5 = pPVar15->aLabel, piVar5 != (int *)0x0)) {
              piVar5[~uVar11] = p->nOp;
            }
            pPVar15->iFixedOp = p->nOp + -1;
            uVar11 = (uint)pIVar14->nColumn;
            sqlite3ExprCacheRemove(pParse,local_ec,uVar11);
            if (pParse->nRangeReg < (int)uVar11) {
              pParse->nRangeReg = uVar11;
              pParse->iRangeReg = local_ec;
            }
            if ((iVar12 != local_ec) &&
               (sqlite3ExprCacheRemove(pParse,iVar12,local_78), pParse->nRangeReg < (int)local_78))
            {
              pParse->nRangeReg = local_78;
              pParse->iRangeReg = iVar12;
            }
          }
        }
        else {
          pPVar15 = p->pParse;
          if (((int)uVar11 < 0) && (piVar5 = pPVar15->aLabel, piVar5 != (int *)0x0)) {
            piVar5[~uVar11] = p->nOp;
          }
          pPVar15->iFixedOp = p->nOp + -1;
        }
      }
      lVar24 = lVar24 + 1;
      pIVar14 = pIVar14->pNext;
    } while (pIVar14 != (Index *)0x0);
  }
  if (uVar9 != 0) {
    sqlite3VdbeAddOp3(p,0x10,0,uVar9 + 1,0);
    uVar9 = p->nOp;
    if (uVar25 < uVar9) {
      p->aOp[uVar25].p2 = uVar9;
    }
    p->pParse->iFixedOp = uVar9 - 1;
  }
  *pbMayReplace = iVar8;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,       /* The parser context */
  Table *pTab,         /* The table being inserted or updated */
  int *aRegIdx,        /* Use register aRegIdx[i] for index i.  0 for unused */
  int iDataCur,        /* Canonical data cursor (main table or PK index) */
  int iIdxCur,         /* First index cursor */
  int regNewData,      /* First register in a range holding values to insert */
  int regOldData,      /* Previous content.  0 for INSERTs */
  u8 pkChng,           /* Non-zero if the rowid or PRIMARY KEY changed */
  u8 overrideError,    /* Override onError to this if not OE_Default */
  int ignoreDest,      /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace    /* OUT: Set to true if constraint may cause a replace */
){
  Vdbe *v;             /* VDBE under constrution */
  Index *pIdx;         /* Pointer to one of the indices */
  Index *pPk = 0;      /* The PRIMARY KEY index */
  sqlite3 *db;         /* Database connection */
  int i;               /* loop counter */
  int ix;              /* Index loop counter */
  int nCol;            /* Number of columns */
  int onError;         /* Conflict resolution strategy */
  int j1;              /* Address of jump instruction */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int nPkField;        /* Number of fields in PRIMARY KEY. 1 for ROWID tables */
  int ipkTop = 0;      /* Top of the rowid change constraint check */
  int ipkBottom = 0;   /* Bottom of the rowid change constraint check */
  u8 isUpdate;         /* True if this is an UPDATE operation */
  u8 bAffinityDone = 0;  /* True if the OP_Affinity operation has been run */
  int regRowid = -1;   /* Register holding ROWID value */

  isUpdate = regOldData!=0;
  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  
  /* pPk is the PRIMARY KEY index for WITHOUT ROWID tables and NULL for
  ** normal rowid tables.  nPkField is the number of key fields in the 
  ** pPk index or 1 for a rowid table.  In other words, nPkField is the
  ** number of fields in the true primary key of the table. */
  if( HasRowid(pTab) ){
    pPk = 0;
    nPkField = 1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    nPkField = pPk->nKeyCol;
  }

  /* Record that this module has started */
  VdbeModuleComment((v, "BEGIN: GenCnstCks(%d,%d,%d,%d,%d)",
                     iDataCur, iIdxCur, regNewData, regOldData, pkChng));

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
        /* Fall through */
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg = sqlite3MPrintf(db, "%s.%s", pTab->zName,
                                    pTab->aCol[i].zName);
        sqlite3VdbeAddOp4(v, OP_HaltIfNull, SQLITE_CONSTRAINT_NOTNULL, onError,
                          regNewData+1+i, zMsg, P4_DYNAMIC);
        sqlite3VdbeChangeP5(v, P5_ConstraintNotNull);
        VdbeCoverage(v);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regNewData+1+i, ignoreDest);
        VdbeCoverage(v);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        j1 = sqlite3VdbeAddOp1(v, OP_NotNull, regNewData+1+i); VdbeCoverage(v);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regNewData+1+i);
        sqlite3VdbeJumpHere(v, j1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->ckBase = regNewData+1;
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk = sqlite3VdbeMakeLabel(v);
      sqlite3ExprIfTrue(pParse, pCheck->a[i].pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
      }else{
        char *zName = pCheck->a[i].zName;
        if( zName==0 ) zName = pTab->zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zName, P4_TRANSIENT,
                              P5_ConstraintCheck);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If rowid is changing, make sure the new rowid does not previously
  ** exist in the table.
  */
  if( pkChng && pPk==0 ){
    int addrRowidOk = sqlite3VdbeMakeLabel(v);

    /* Figure out what action to take in case of a rowid collision */
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    if( isUpdate ){
      /* pkChng!=0 does not mean that the rowid has change, only that
      ** it might have changed.  Skip the conflict logic below if the rowid
      ** is unchanged. */
      sqlite3VdbeAddOp3(v, OP_Eq, regNewData, addrRowidOk, regOldData);
      sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      VdbeCoverage(v);
    }

    /* If the response to a rowid conflict is REPLACE but the response
    ** to some other UNIQUE constraint is FAIL or IGNORE, then we need
    ** to defer the running of the rowid conflict checking until after
    ** the UNIQUE constraints have run.
    */
    if( onError==OE_Replace && overrideError!=OE_Replace ){
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Ignore || pIdx->onError==OE_Fail ){
          ipkTop = sqlite3VdbeAddOp0(v, OP_Goto);
          break;
        }
      }
    }

    /* Check to see if the new rowid already exists in the table.  Skip
    ** the following conflict logic if it does not. */
    sqlite3VdbeAddOp3(v, OP_NotExists, iDataCur, addrRowidOk, regNewData);
    VdbeCoverage(v);

    /* Generate code that deals with a rowid collision */
    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3RowidConstraint(pParse, onError, pTab);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                   regNewData, 1, 0, OE_Replace, 1);
        }else if( pTab->pIndex ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur, 0);
        }
        seenReplace = 1;
        break;
      }
      case OE_Ignore: {
        /*assert( seenReplace==0 );*/
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrRowidOk);
    if( ipkTop ){
      ipkBottom = sqlite3VdbeAddOp0(v, OP_Goto);
      sqlite3VdbeJumpHere(v, ipkTop);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Compute the revised record entries for indices as we go.
  **
  ** This loop also handles the case of the PRIMARY KEY index for a
  ** WITHOUT ROWID table.
  */
  for(ix=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, ix++){
    int regIdx;          /* Range of registers hold conent for pIdx */
    int regR;            /* Range of registers holding conflicting PK */
    int iThisCur;        /* Cursor for this UNIQUE index */
    int addrUniqueOk;    /* Jump here if the UNIQUE constraint is satisfied */

    if( aRegIdx[ix]==0 ) continue;  /* Skip indices that do not change */
    if( bAffinityDone==0 ){
      sqlite3TableAffinity(v, pTab, regNewData+1);
      bAffinityDone = 1;
    }
    iThisCur = iIdxCur+ix;
    addrUniqueOk = sqlite3VdbeMakeLabel(v);

    /* Skip partial indices for which the WHERE clause is not true */
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, aRegIdx[ix]);
      pParse->ckBase = regNewData+1;
      sqlite3ExprIfFalse(pParse, pIdx->pPartIdxWhere, addrUniqueOk,
                         SQLITE_JUMPIFNULL);
      pParse->ckBase = 0;
    }

    /* Create a record for this index entry as it should appear after
    ** the insert or update.  Store that record in the aRegIdx[ix] register
    */
    regIdx = sqlite3GetTempRange(pParse, pIdx->nColumn);
    for(i=0; i<pIdx->nColumn; i++){
      int iField = pIdx->aiColumn[i];
      int x;
      if( iField<0 || iField==pTab->iPKey ){
        if( regRowid==regIdx+i ) continue; /* ROWID already in regIdx+i */
        x = regNewData;
        regRowid =  pIdx->pPartIdxWhere ? -1 : regIdx+i;
      }else{
        x = iField + regNewData + 1;
      }
      sqlite3VdbeAddOp2(v, OP_SCopy, x, regIdx+i);
      VdbeComment((v, "%s", iField<0 ? "rowid" : pTab->aCol[iField].zName));
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn, aRegIdx[ix]);
    VdbeComment((v, "for %s", pIdx->zName));
    sqlite3ExprCacheAffinityChange(pParse, regIdx, pIdx->nColumn);

    /* In an UPDATE operation, if this index is the PRIMARY KEY index 
    ** of a WITHOUT ROWID table and there has been no change the
    ** primary key, then no collision is possible.  The collision detection
    ** logic below can all be skipped. */
    if( isUpdate && pPk==pIdx && pkChng==0 ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }

    /* Find out what action to take in case there is a uniqueness conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn);
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    
    /* Check to see if the new index entry will be unique */
    sqlite3VdbeAddOp4Int(v, OP_NoConflict, iThisCur, addrUniqueOk,
                         regIdx, pIdx->nKeyCol); VdbeCoverage(v);

    /* Generate code to handle collisions */
    regR = (pIdx==pPk) ? regIdx : sqlite3GetTempRange(pParse, nPkField);
    if( isUpdate || onError==OE_Replace ){
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iThisCur, regR);
        /* Conflict only if the rowid of the existing index entry
        ** is different from old-rowid */
        if( isUpdate ){
          sqlite3VdbeAddOp3(v, OP_Eq, regR, addrUniqueOk, regOldData);
          sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
          VdbeCoverage(v);
        }
      }else{
        int x;
        /* Extract the PRIMARY KEY from the end of the index entry and
        ** store it in registers regR..regR+nPk-1 */
        if( pIdx!=pPk ){
          for(i=0; i<pPk->nKeyCol; i++){
            x = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
            sqlite3VdbeAddOp3(v, OP_Column, iThisCur, x, regR+i);
            VdbeComment((v, "%s.%s", pTab->zName,
                         pTab->aCol[pPk->aiColumn[i]].zName));
          }
        }
        if( isUpdate ){
          /* If currently processing the PRIMARY KEY of a WITHOUT ROWID 
          ** table, only conflict if the new PRIMARY KEY values are actually
          ** different from the old.
          **
          ** For a UNIQUE index, only conflict if the PRIMARY KEY values
          ** of the matched index row are different from the original PRIMARY
          ** KEY values of this row before the update.  */
          int addrJump = sqlite3VdbeCurrentAddr(v)+pPk->nKeyCol;
          int op = OP_Ne;
          int regCmp = (IsPrimaryKeyIndex(pIdx) ? regIdx : regR);
  
          for(i=0; i<pPk->nKeyCol; i++){
            char *p4 = (char*)sqlite3LocateCollSeq(pParse, pPk->azColl[i]);
            x = pPk->aiColumn[i];
            if( i==(pPk->nKeyCol-1) ){
              addrJump = addrUniqueOk;
              op = OP_Eq;
            }
            sqlite3VdbeAddOp4(v, op, 
                regOldData+1+x, addrJump, regCmp+i, p4, P4_COLLSEQ
            );
            sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
            VdbeCoverageIf(v, op==OP_Eq);
            VdbeCoverageIf(v, op==OP_Ne);
          }
        }
      }
    }

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3UniqueConstraint(pParse, onError, pIdx);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        sqlite3MultiWrite(pParse);
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                 regR, nPkField, 0, OE_Replace, pIdx==pPk);
        seenReplace = 1;
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrUniqueOk);
    sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn);
    if( regR!=regIdx ) sqlite3ReleaseTempRange(pParse, regR, nPkField);
  }
  if( ipkTop ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, ipkTop+1);
    sqlite3VdbeJumpHere(v, ipkBottom);
  }
  
  *pbMayReplace = seenReplace;
  VdbeModuleComment((v, "END: GenCnstCks(%d)", seenReplace));
}